

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

bool units::detail::base_access<9>::minus_overflows<units::detail::unit_data>
               (unit_data *a,unit_data *b)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ((int)*a << 4) >> 0x1e;
  iVar2 = ((int)*b << 4) >> 0x1e;
  if (iVar2 < 0) {
    return iVar2 + 1 < iVar1;
  }
  if ((uint)((int)*b << 4) < 0x40000000) {
    return false;
  }
  return iVar1 < iVar2 + -2;
}

Assistant:

constexpr int count() const { return count_; }